

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::CopyFileTime(string *fromFile,string *toFile)

{
  int iVar1;
  char *pcVar2;
  undefined1 local_c0 [8];
  utimbuf buf;
  stat fromStat;
  string *toFile_local;
  string *fromFile_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(pcVar2,(stat *)&buf.modtime);
  if (iVar1 < 0) {
    fromFile_local._7_1_ = false;
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = utime(pcVar2,(utimbuf *)local_c0);
    fromFile_local._7_1_ = -1 < iVar1;
  }
  return fromFile_local._7_1_;
}

Assistant:

bool cmSystemTools::CopyFileTime(const std::string& fromFile,
                                 const std::string& toFile)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  cmSystemToolsWindowsHandle hFrom = CreateFileW(
    SystemTools::ConvertToWindowsExtendedPath(fromFile).c_str(), GENERIC_READ,
    FILE_SHARE_READ, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  cmSystemToolsWindowsHandle hTo = CreateFileW(
    SystemTools::ConvertToWindowsExtendedPath(toFile).c_str(),
    FILE_WRITE_ATTRIBUTES, 0, 0, OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!hFrom || !hTo) {
    return false;
  }
  FILETIME timeCreation;
  FILETIME timeLastAccess;
  FILETIME timeLastWrite;
  if (!GetFileTime(hFrom, &timeCreation, &timeLastAccess, &timeLastWrite)) {
    return false;
  }
  return SetFileTime(hTo, &timeCreation, &timeLastAccess, &timeLastWrite) != 0;
#else
  struct stat fromStat;
  if (stat(fromFile.c_str(), &fromStat) < 0) {
    return false;
  }

  struct utimbuf buf;
  buf.actime = fromStat.st_atime;
  buf.modtime = fromStat.st_mtime;
  return utime(toFile.c_str(), &buf) >= 0;
#endif
}